

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O2

int __thiscall
CVmObjFile::getp_open_text(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_obj_id_t self_00;
  vm_rcdesc rc;
  
  self_00 = CVmMetaclass::get_class_obj(metaclass_reg_);
  vm_rcdesc::vm_rcdesc(&rc,"File.openTextFile",self_00,1,sp_ + -1,argc);
  s_getp_open_text(retval,argc,0,&rc);
  return 1;
}

Assistant:

int CVmObjFile::getp_open_text(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc)
{
    vm_rcdesc rc(vmg_ "File.openTextFile",
                 CVmObjFile::metaclass_reg_->get_class_obj(vmg0_),
                 VMOBJFILE_OPEN_TEXT, G_stk->get(0), argc);
    return s_getp_open_text(vmg_ retval, argc, FALSE, &rc);
}